

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O3

void Cec_ManSmfSetDefaultParams(Cec_ParSmf_t *p)

{
  p->nWords = 0x1f;
  p->nRounds = 200;
  p->nFrames = 200;
  p->nNonRefines = 3;
  p->nMinOutputs = 0;
  p->nBTLimit = 100;
  p->TimeLimit = 0;
  p->fDualOut = 0;
  p->fCheckMiter = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

void Cec_ManSmfSetDefaultParams( Cec_ParSmf_t * p )
{
    memset( p, 0, sizeof(Cec_ParSmf_t) );
    p->nWords         =      31;  // the number of simulation words
    p->nRounds        =     200;  // the number of simulation rounds
    p->nFrames        =     200;  // the max number of time frames
    p->nNonRefines    =       3;  // the max number of rounds without refinement
    p->nMinOutputs    =       0;  // the min outputs to accumulate
    p->nBTLimit       =     100;  // conflict limit at a node
    p->TimeLimit      =       0;  // the runtime limit in seconds
    p->fDualOut       =       0;  // miter with separate outputs
    p->fCheckMiter    =       0;  // the circuit is the miter
//    p->fFirstStop     =       0;  // stop on the first sat output
    p->fVerbose       =       0;  // verbose stats
}